

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# specreaderimpl.cpp
# Opt level: O3

bool __thiscall
apngasm::spec::priv::anon_unknown_0::s2u(anon_unknown_0 *this,string *str,uint *pOut)

{
  bool bVar1;
  uint result;
  uint local_2c;
  anon_unknown_0 *local_28;
  anon_unknown_0 *local_20;
  type_info_t *local_18;
  
  if (pOut == (uint *)0x0) {
    bVar1 = false;
  }
  else {
    local_2c = 0;
    local_20 = this + (long)&str->_M_dataplus;
    local_28 = this;
    bVar1 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
            shr_unsigned<unsigned_int>
                      ((lexical_ostream_limited_src<char,_std::char_traits<char>_> *)&local_28,
                       &local_2c);
    if (!bVar1) {
      local_28 = (anon_unknown_0 *)&PTR__bad_cast_0017f458;
      local_20 = (anon_unknown_0 *)&std::__cxx11::string::typeinfo;
      local_18 = (type_info_t *)&unsigned_int::typeinfo;
      boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)&local_28);
    }
    *pOut = local_2c;
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool s2u(const std::string& str, unsigned int* pOut)
        {
          if(pOut == NULL)
            return false;

          try
          {
            *pOut = boost::lexical_cast<unsigned int>(str);
            return true;
          }
          catch(boost::bad_lexical_cast& e)
          {
            return false;
          }
        }